

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void __thiscall gflags::anon_unknown_2::FlagValue::~FlagValue(FlagValue *this)

{
  string *this_00;
  
  if (this->owns_value_ != true) {
switchD_0013e673_default:
    return;
  }
  switch(this->type_) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
    this_00 = (string *)this->value_buffer_;
    break;
  case '\x06':
    this_00 = (string *)this->value_buffer_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
    }
    break;
  default:
    goto switchD_0013e673_default;
  }
  operator_delete(this_00);
  return;
}

Assistant:

FlagValue::~FlagValue() {
  if (!owns_value_) {
    return;
  }
  switch (type_) {
    case FV_BOOL: delete reinterpret_cast<bool*>(value_buffer_); break;
    case FV_INT32: delete reinterpret_cast<int32*>(value_buffer_); break;
    case FV_UINT32: delete reinterpret_cast<uint32*>(value_buffer_); break;
    case FV_INT64: delete reinterpret_cast<int64*>(value_buffer_); break;
    case FV_UINT64: delete reinterpret_cast<uint64*>(value_buffer_); break;
    case FV_DOUBLE: delete reinterpret_cast<double*>(value_buffer_); break;
    case FV_STRING: delete reinterpret_cast<string*>(value_buffer_); break;
  }
}